

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall soplex::SPxLPBase<double>::SPxLPBase(SPxLPBase<double> *this,SPxLPBase<double> *old)

{
  long in_RSI;
  shared_ptr<soplex::Tolerances> *in_RDI;
  LPRowSetBase<double> *in_stack_00000008;
  LPRowSetBase<double> *in_stack_00000010;
  shared_ptr<soplex::Tolerances> *in_stack_ffffffffffffffe0;
  
  LPRowSetBase<double>::LPRowSetBase(in_stack_00000010,in_stack_00000008);
  LPColSetBase<double>::LPColSetBase
            ((LPColSetBase<double> *)in_stack_00000010,(LPColSetBase<double> *)in_stack_00000008);
  (in_RDI->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR__SPxLPBase_004ec148;
  in_RDI[0xc].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__SPxLPBase_004ec3e8;
  *(undefined4 *)
   &in_RDI[0x19].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(undefined4 *)(in_RSI + 400);
  in_RDI[0x19].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x198);
  *(byte *)&in_RDI[0x1a].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(byte *)(in_RSI + 0x1a0) & 1;
  in_RDI[0x1a].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 0x1a8);
  in_RDI[0x1b].super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       *(element_type **)(in_RSI + 0x1b0);
  std::shared_ptr<soplex::Tolerances>::shared_ptr((shared_ptr<soplex::Tolerances> *)0x45a5b0);
  std::shared_ptr<soplex::Tolerances>::operator=(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

SPxLPBase(const SPxLPBase<R>& old)
      : LPRowSetBase<R>(old)
      , LPColSetBase<R>(old)
      , thesense(old.thesense)
      , offset(old.offset)
      , _isScaled(old._isScaled)
      , lp_scaler(old.lp_scaler)
      , spxout(old.spxout)
   {
      _tolerances = old._tolerances;
      assert(isConsistent());
   }